

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O1

void ReturnResponseThread<int>
               (CMConnection conn,CMFormat ReadResponseFormat,AnonADIOSFile *f,size_t readSize,
               int *RawData,void *Dest,int GetResponseCondition,Accuracy acc,string *name,
               DataType vartype,size_t stepStart,size_t stepCount,Dims *count,Dims *start,
               size_t blockid,bool boxselection)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  char *unaff_RBP;
  char *local_98;
  long local_90;
  char local_88 [16];
  ulong local_78;
  void *pvStack_70;
  undefined8 local_68;
  uint64_t uStack_60;
  int *local_58;
  string local_50;
  
  local_78 = (ulong)(uint)GetResponseCondition;
  local_68 = 0x7f;
  pvStack_70 = Dest;
  uStack_60 = readSize;
  local_58 = RawData;
  if (1 < verbose) {
    unaff_RBP = (char *)(ulong)vartype;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Returning ",10);
    if (boxselection) {
      readable_size_abi_cxx11_(&local_50,uStack_60);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," for Get<",9);
      adios2::ToString_abi_cxx11_((DataType)&local_98);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_98,local_90);
      unaff_RBP = local_88;
      if (local_98 != unaff_RBP) {
        operator_delete(local_98);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,">(",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") start = ",10);
      adios2::ToString_abi_cxx11_((vector *)&local_98);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_98,local_90);
      if (local_98 != unaff_RBP) {
        operator_delete(local_98);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," count = ",9);
      adios2::ToString_abi_cxx11_((vector *)&local_98);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_98,local_90);
      if (local_98 != unaff_RBP) {
        operator_delete(local_98);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," steps = ",9);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"..",2);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    else {
      readable_size_abi_cxx11_(&local_50,uStack_60);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," for Get<",9);
      adios2::ToString_abi_cxx11_((DataType)&local_98);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_98,local_90);
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,">(",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") block = ",10);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  CMwrite(conn,ReadResponseFormat,&local_78);
  free(local_58);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mutex_nThreads);
  if (iVar1 != 0) {
    uVar3 = std::__throw_system_error(iVar1);
    if (local_98 != unaff_RBP) {
      operator_delete(local_98);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    _Unwind_Resume(uVar3);
  }
  f->m_BytesSent = uStack_60 + f->m_BytesSent;
  f->m_OperationCount = f->m_OperationCount + 1;
  TotalGetBytesSent = TotalGetBytesSent + uStack_60;
  TotalGets = TotalGets + 1;
  nThreads = nThreads - 1;
  pthread_mutex_unlock((pthread_mutex_t *)&mutex_nThreads);
  return;
}

Assistant:

void ReturnResponseThread(CMConnection conn, CMFormat ReadResponseFormat, AnonADIOSFile *f,
                          size_t readSize, T *RawData, void *Dest, int GetResponseCondition,
                          Accuracy acc, std::string name, adios2::DataType vartype,
                          size_t stepStart, size_t stepCount, adios2::Dims count,
                          adios2::Dims start, size_t blockid, bool boxselection)

{
    _ReadResponseMsg Response;
    memset(&Response, 0, sizeof(Response));
    Response.Size = readSize;
    Response.ReadResponseCondition = GetResponseCondition;
    Response.Dest = Dest; /* final data destination in client memory space */
    Response.OperatorType = Operator::OperatorType::COMPRESS_NULL;

    if (acc.error > 0.0)
    {
#if defined(ADIOS2_HAVE_MGARD) || defined(ADIOS2_HAVE_ZFP)
#if defined(ADIOS2_HAVE_MGARD)
        Params p = {{"accuracy", std::to_string(acc.error)},
                    {"s", std::to_string(acc.norm)},
                    {"mode", (acc.relative ? "REL" : "ABS")}};
        auto op = MakeOperator("mgard", p);
#elif defined(ADIOS2_HAVE_ZFP)
        Params p = {{"accuracy", std::to_string(acc.error)}};
        auto op = MakeOperator("zfp", p);
#endif
        // TODO: would be nicer:
        // op.SetAccuracy(Accuracy(GetMsg->error, GetMsg->norm, GetMsg->relative));
        T *CompressedData = (T *)malloc(Response.Size);
        adios2::Dims c;
        if (stepCount <= 1)
        {
            c = count;
        }
        else
        {
            c = helper::DimsWithStep(stepCount, count);
        }
        size_t result = op->Operate((char *)RawData, {}, c, vartype, (char *)CompressedData);
        if (result == 0)
        {
            Response.ReadData = (char *)RawData;
            free(CompressedData);
        }
        else
        {
            Response.ReadData = (char *)CompressedData;
            Response.Size = result;
            Response.OperatorType = op->m_TypeEnum;
            free(RawData);
        }
#else
        Response.ReadData = (char *)RawData;
#endif
    }
    else
    {
        Response.ReadData = (char *)RawData;
    }

    if (verbose >= 2)
    {
        if (boxselection)
        {
            std::cout << "Returning " << readable_size(Response.Size) << " for Get<" << vartype
                      << ">(" << name << ") start = " << start << " count = " << count
                      << " steps = " << stepStart << ".." << stepStart + stepCount - 1 << std::endl;
        }
        else
        {
            std::cout << "Returning " << readable_size(Response.Size) << " for Get<" << vartype
                      << ">(" << name << ") block = " << blockid << std::endl;
        }
    }
    // std::cout << "-- start sending response --" << std::endl;
    CMwrite(conn, ReadResponseFormat, &Response);
    free(Response.ReadData);
    // std::cout << "-- sent response --" << std::endl;
    {
        // std::cout << "-- get lock --" << std::endl;
        std::lock_guard<std::mutex> lockGuard(mutex_nThreads);
        // std::cout << "-- lock acquired --" << std::endl;
        f->m_BytesSent += Response.Size;
        f->m_OperationCount++;
        TotalGetBytesSent += Response.Size;
        TotalGets++;
        --nThreads;
    }
    // std::cout << "-- done --" << std::endl;
}